

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

double __thiscall Highs::getHighsInfinity(Highs *this)

{
  Highs *in_RDI;
  double dVar1;
  string *alt_method_name;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  alt_method_name = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_29 + 1),"getHighsInfinity",(allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"getInfinity",(allocator *)&stack0xffffffffffffff9f)
  ;
  deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  dVar1 = getInfinity(in_RDI);
  return dVar1;
}

Assistant:

double Highs::getHighsInfinity() {
  deprecationMessage("getHighsInfinity", "getInfinity");
  return getInfinity();
}